

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::SetSerializedPbInterval
          (Generator *this,FileDescriptorProto *file)

{
  EnumDescriptor *pEVar1;
  ServiceDescriptor *pSVar2;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 *paVar3;
  FileDescriptorProto *pFVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *descriptor_proto;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *message_proto;
  FileDescriptor *pFVar5;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>_>
  *descriptor_proto_00;
  undefined8 extraout_RAX;
  long lVar6;
  long lVar7;
  string_view name;
  string_view name_00;
  string local_58;
  FileDescriptorProto *local_38;
  
  pFVar5 = this->file_;
  local_38 = file;
  if (0 < pFVar5->enum_type_count_) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pEVar1 = pFVar5->enum_types_;
      descriptor_proto =
           protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                     (&(file->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase,(int)lVar7);
      ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
                (&local_58,this,(EnumDescriptor *)(&pEVar1->super_SymbolBase + lVar6));
      name._M_str = local_58._M_dataplus._M_p;
      name._M_len = local_58._M_string_length;
      PrintSerializedPbInterval<google::protobuf::EnumDescriptorProto>(this,descriptor_proto,name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
      pFVar5 = this->file_;
      lVar6 = lVar6 + 0x58;
    } while (lVar7 < pFVar5->enum_type_count_);
  }
  pFVar4 = local_38;
  if (0 < pFVar5->message_type_count_) {
    paVar3 = &local_38->field_0;
    lVar6 = 0;
    lVar7 = 0;
    do {
      message_proto =
           protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(paVar3->_impl_).message_type_.super_RepeatedPtrFieldBase,(int)lVar7);
      if (this->file_->message_type_count_ <= lVar7) {
        SetSerializedPbInterval();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      SetMessagePbInterval
                (this,message_proto,
                 (Descriptor *)(&this->file_->message_types_->super_SymbolBase + lVar6));
      lVar7 = lVar7 + 1;
      pFVar5 = this->file_;
      lVar6 = lVar6 + 0xa0;
    } while (lVar7 < pFVar5->message_type_count_);
  }
  if (0 < pFVar5->service_count_) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pSVar2 = pFVar5->services_;
      descriptor_proto_00 =
           protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>>
                     (&(pFVar4->field_0)._impl_.service_.super_RepeatedPtrFieldBase,(int)lVar7);
      ModuleLevelServiceDescriptorName_abi_cxx11_
                (&local_58,this,(ServiceDescriptor *)(&pSVar2->super_SymbolBase + lVar6));
      name_00._M_str = local_58._M_dataplus._M_p;
      name_00._M_len = local_58._M_string_length;
      PrintSerializedPbInterval<google::protobuf::ServiceDescriptorProto>
                (this,descriptor_proto_00,name_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      lVar7 = lVar7 + 1;
      pFVar5 = this->file_;
      lVar6 = lVar6 + 0x40;
    } while (lVar7 < pFVar5->service_count_);
  }
  return;
}

Assistant:

void Generator::SetSerializedPbInterval(const FileDescriptorProto& file) const {
  // Top level enums.
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    const EnumDescriptor& descriptor = *file_->enum_type(i);
    PrintSerializedPbInterval(file.enum_type(i),
                              ModuleLevelDescriptorName(descriptor));
  }

  // Messages.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    SetMessagePbInterval(file.message_type(i), *file_->message_type(i));
  }

  // Services.
  for (int i = 0; i < file_->service_count(); ++i) {
    const ServiceDescriptor& service = *file_->service(i);
    PrintSerializedPbInterval(file.service(i),
                              ModuleLevelServiceDescriptorName(service));
  }
}